

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbeMergeEngineFree(MergeEngine *pMerger)

{
  long lVar1;
  long lVar2;
  
  if (pMerger != (MergeEngine *)0x0) {
    if (0 < pMerger->nTree) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        vdbePmaReaderClear((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x50;
      } while (lVar2 < pMerger->nTree);
    }
    sqlite3_free(pMerger);
    return;
  }
  return;
}

Assistant:

static void vdbeMergeEngineFree(MergeEngine *pMerger){
  int i;
  if( pMerger ){
    for(i=0; i<pMerger->nTree; i++){
      vdbePmaReaderClear(&pMerger->aReadr[i]);
    }
  }
  sqlite3_free(pMerger);
}